

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2.cc
# Opt level: O0

void BLAKE2B256_Update(BLAKE2B_CTX *b2b,void *in_data,size_t len)

{
  size_t local_30;
  size_t todo;
  uint8_t *data;
  size_t len_local;
  void *in_data_local;
  BLAKE2B_CTX *b2b_local;
  
  if (len != 0) {
    local_30 = 0x80 - b2b->block_used;
    if (len < local_30) {
      local_30 = len;
    }
    OPENSSL_memcpy(b2b->block + b2b->block_used,in_data,local_30);
    b2b->block_used = local_30 + b2b->block_used;
    todo = local_30 + (long)in_data;
    data = (uint8_t *)(len - local_30);
    if (data != (uint8_t *)0x0) {
      if (b2b->block_used != 0x80) {
        __assert_fail("b2b->block_used == BLAKE2B_CBLOCK",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/blake2/blake2.cc"
                      ,0x8b,"void BLAKE2B256_Update(BLAKE2B_CTX *, const void *, size_t)");
      }
      blake2b_transform(b2b,b2b->block,0x80,0);
      b2b->block_used = 0;
      for (; (uint8_t *)0x80 < data; data = data + -0x80) {
        blake2b_transform(b2b,(uint8_t *)todo,0x80,0);
        todo = todo + 0x80;
      }
      OPENSSL_memcpy(b2b->block,(void *)todo,(size_t)data);
      b2b->block_used = (size_t)data;
    }
  }
  return;
}

Assistant:

void BLAKE2B256_Update(BLAKE2B_CTX *b2b, const void *in_data, size_t len) {
  if (len == 0) {
    // Work around a C language bug. See https://crbug.com/1019588.
    return;
  }

  const uint8_t *data = reinterpret_cast<const uint8_t *>(in_data);
  size_t todo = sizeof(b2b->block) - b2b->block_used;
  if (todo > len) {
    todo = len;
  }
  OPENSSL_memcpy(&b2b->block[b2b->block_used], data, todo);
  b2b->block_used += todo;
  data += todo;
  len -= todo;

  if (!len) {
    return;
  }

  // More input remains therefore we must have filled |b2b->block|.
  assert(b2b->block_used == BLAKE2B_CBLOCK);
  blake2b_transform(b2b, b2b->block, BLAKE2B_CBLOCK,
                    /*is_final_block=*/0);
  b2b->block_used = 0;

  while (len > BLAKE2B_CBLOCK) {
    blake2b_transform(b2b, data, BLAKE2B_CBLOCK, /*is_final_block=*/0);
    data += BLAKE2B_CBLOCK;
    len -= BLAKE2B_CBLOCK;
  }

  OPENSSL_memcpy(b2b->block, data, len);
  b2b->block_used = len;
}